

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.h
# Opt level: O2

void wallet::CKeyMetadata::SerializationOps<DataStream,wallet::CKeyMetadata_const,ActionSerialize>
               (int *obj,DataStream *s)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SerializeMany<DataStream,int,long>(s,obj,(long *)(obj + 2));
  if (9 < *obj) {
    SerializeMany<DataStream,std::__cxx11::string,CKeyID>
              (s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(obj + 4),
               (CKeyID *)(obj + 0xc));
    if (0xb < *obj) {
      KeyOriginInfo::SerializationOps<DataStream,KeyOriginInfo_const,ActionSerialize>(obj + 0x12,s);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        SerializeMany<DataStream,bool>(s,(bool *)(obj + 0x1a));
        return;
      }
      goto LAB_001a892e;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_001a892e:
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CKeyMetadata, obj)
    {
        READWRITE(obj.nVersion, obj.nCreateTime);
        if (obj.nVersion >= VERSION_WITH_HDDATA) {
            READWRITE(obj.hdKeypath, obj.hd_seed_id);
        }
        if (obj.nVersion >= VERSION_WITH_KEY_ORIGIN)
        {
            READWRITE(obj.key_origin);
            READWRITE(obj.has_key_origin);
        }
    }